

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GridDataType1.cpp
# Opt level: O0

KBOOL __thiscall
KDIS::DATA_TYPE::GridDataType1::operator==(GridDataType1 *this,GridDataType1 *Value)

{
  undefined1 *puVar1;
  float fVar2;
  KBOOL KVar3;
  bool bVar4;
  GridDataType1 *Value_local;
  GridDataType1 *this_local;
  
  KVar3 = GridData::operator!=(&this->super_GridData,&Value->super_GridData);
  if (KVar3) {
    this_local._7_1_ = false;
  }
  else {
    fVar2 = *(float *)&(this->super_GridData).field_0xc;
    puVar1 = &(Value->super_GridData).field_0xc;
    if ((fVar2 != *(float *)puVar1) || (NAN(fVar2) || NAN(*(float *)puVar1))) {
      this_local._7_1_ = false;
    }
    else if (((float)this->m_f32FieldOffset != (float)Value->m_f32FieldOffset) ||
            (NAN((float)this->m_f32FieldOffset) || NAN((float)Value->m_f32FieldOffset))) {
      this_local._7_1_ = false;
    }
    else if (this->m_ui16NumValues == Value->m_ui16NumValues) {
      bVar4 = std::operator!=(&this->m_vui16Values,&Value->m_vui16Values);
      if (bVar4) {
        this_local._7_1_ = false;
      }
      else {
        this_local._7_1_ = true;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

KBOOL GridDataType1::operator == ( const GridDataType1 & Value ) const
{
    if( GridData::operator != ( Value ) )            return false;
    if( m_f32FieldScale  != Value.m_f32FieldScale )  return false;
    if( m_f32FieldOffset != Value.m_f32FieldOffset ) return false;
    if( m_ui16NumValues  != Value.m_ui16NumValues )  return false;
    if( m_vui16Values    != Value.m_vui16Values )    return false;
    return true;
}